

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O0

bool __thiscall
MT32Emu::MidiStreamParserImpl::checkStreamBufferCapacity
          (MidiStreamParserImpl *this,bool preserveContent)

{
  Bit8u *__src;
  Bit8u *pBVar1;
  Bit8u *oldStreamBuffer;
  bool preserveContent_local;
  MidiStreamParserImpl *this_local;
  
  if (this->streamBufferSize < this->streamBufferCapacity) {
    this_local._7_1_ = true;
  }
  else if (this->streamBufferCapacity < 0x8000) {
    __src = this->streamBuffer;
    this->streamBufferCapacity = 0x8000;
    pBVar1 = (Bit8u *)operator_new__((ulong)this->streamBufferCapacity);
    this->streamBuffer = pBVar1;
    if (preserveContent) {
      memcpy(this->streamBuffer,__src,(ulong)this->streamBufferSize);
    }
    if (__src != (Bit8u *)0x0) {
      operator_delete__(__src);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MidiStreamParserImpl::checkStreamBufferCapacity(const bool preserveContent) {
	if (streamBufferSize < streamBufferCapacity) return true;
	if (streamBufferCapacity < MAX_STREAM_BUFFER_SIZE) {
		Bit8u *oldStreamBuffer = streamBuffer;
		streamBufferCapacity = MAX_STREAM_BUFFER_SIZE;
		streamBuffer = new Bit8u[streamBufferCapacity];
		if (preserveContent) memcpy(streamBuffer, oldStreamBuffer, streamBufferSize);
		delete[] oldStreamBuffer;
		return true;
	}
	return false;
}